

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O1

Vec_Int_t * Abc_NamComputeIdMap(Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (p1->vInt2Handle).nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar5 = uVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar5;
  if (p1 == p2) {
    if (uVar5 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar5 << 2);
    }
    pVVar2->pArray = piVar3;
    pVVar2->nSize = uVar1;
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        piVar3[uVar7] = (int)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else {
    if (uVar5 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar5 << 2);
    }
    pVVar2->pArray = piVar3;
    pVVar2->nSize = uVar1;
    memset(piVar3,0,(long)(int)uVar1 << 2);
    if (1 < (p1->vInt2Handle).nSize) {
      uVar7 = 1;
      if (1 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      uVar6 = 1;
      do {
        piVar4 = Abc_NamStrHashFind(p2,p1->pStore + (p1->vInt2Handle).pArray[uVar6],(char *)0x0);
        if (uVar7 == uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar3[uVar6] = *piVar4;
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)(p1->vInt2Handle).nSize);
    }
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Abc_NamComputeIdMap( Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    Vec_Int_t * vMap;
    char * pThis;
    int * piPlace, iHandle1, i;
    if ( p1 == p2 )
        return Vec_IntStartNatural( Abc_NamObjNumMax(p1) );
    vMap = Vec_IntStart( Abc_NamObjNumMax(p1) );
    Vec_IntForEachEntryStart( &p1->vInt2Handle, iHandle1, i, 1 )
    {
        pThis = Abc_NamHandleToStr( p1, iHandle1 );
        piPlace = Abc_NamStrHashFind( p2, pThis, NULL );
        Vec_IntWriteEntry( vMap, i, *piPlace );
//        Abc_Print( 1, "%d->%d  ", i, *piPlace );
    }
    return vMap;
}